

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_force(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *in_RDI;
  CHAR_DATA *victim;
  char arg2 [4608];
  char arg [4608];
  char buf [4608];
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  char *in_stack_00003720;
  CHAR_DATA *in_stack_00003728;
  CHAR_DATA *in_stack_ffffffffffffc9b8;
  undefined4 in_stack_ffffffffffffc9c0;
  undefined4 in_stack_ffffffffffffc9c4;
  int in_stack_ffffffffffffc9c8;
  int in_stack_ffffffffffffc9cc;
  CHAR_DATA *in_stack_ffffffffffffc9d0;
  CHAR_DATA *in_stack_ffffffffffffc9d8;
  char *in_stack_ffffffffffffc9e0;
  char *in_stack_ffffffffffffc9e8;
  char local_2428 [4584];
  char *in_stack_ffffffffffffedc0;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  char local_1228 [4616];
  CHAR_DATA *local_20;
  CHAR_DATA *local_18;
  char *local_10;
  CHAR_DATA *local_8;
  
  local_8 = in_RDI;
  local_10 = one_argument((char *)CONCAT44(in_stack_ffffffffffffc9c4,in_stack_ffffffffffffc9c0),
                          (char *)in_stack_ffffffffffffc9b8);
  if ((local_2428[0] == '\0') || (*local_10 == '\0')) {
    send_to_char((char *)in_stack_ffffffffffffc9d0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
  }
  else {
    one_argument((char *)CONCAT44(in_stack_ffffffffffffc9c4,in_stack_ffffffffffffc9c0),
                 (char *)in_stack_ffffffffffffc9b8);
    bVar1 = str_cmp(&stack0xffffffffffffc9d8,"delete");
    if ((bVar1) && (bVar1 = str_prefix(in_stack_ffffffffffffc9e8,in_stack_ffffffffffffc9e0), bVar1))
    {
      sprintf(local_1228,"$n forces you to \'%s\'.",local_10);
      bVar1 = str_cmp(local_2428,"all");
      if (bVar1) {
        bVar1 = str_cmp(local_2428,"players");
        if (bVar1) {
          bVar1 = str_cmp(local_2428,"gods");
          if (bVar1) {
            in_stack_ffffffffffffc9d0 =
                 get_char_world(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0);
            if (in_stack_ffffffffffffc9d0 == (CHAR_DATA *)0x0) {
              send_to_char((char *)0x0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
              return;
            }
            if (in_stack_ffffffffffffc9d0 == local_8) {
              send_to_char((char *)in_stack_ffffffffffffc9d0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
              return;
            }
            bVar1 = is_room_owner(in_stack_ffffffffffffc9b8,(ROOM_INDEX_DATA *)0x592519);
            if ((((!bVar1) && (local_8->in_room != in_stack_ffffffffffffc9d0->in_room)) &&
                (bVar1 = room_is_private(in_stack_ffffffffffffc9d0->in_room), bVar1)) &&
               (bVar1 = is_trusted(in_stack_ffffffffffffc9b8,0), !bVar1)) {
              send_to_char((char *)in_stack_ffffffffffffc9d0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
              return;
            }
            iVar2 = get_trust(in_stack_ffffffffffffc9b8);
            iVar3 = get_trust(in_stack_ffffffffffffc9b8);
            if (iVar3 <= iVar2) {
              send_to_char((char *)in_stack_ffffffffffffc9d0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
              return;
            }
            bVar1 = is_npc(in_stack_ffffffffffffc9b8);
            if ((!bVar1) && (iVar3 = get_trust(in_stack_ffffffffffffc9b8), iVar3 < 0x39)) {
              send_to_char((char *)in_stack_ffffffffffffc9d0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
              return;
            }
            act((char *)in_stack_ffffffffffffc9d0,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8),
                (void *)CONCAT44(in_stack_ffffffffffffc9c4,iVar2),in_stack_ffffffffffffc9b8,0);
            interpret(in_stack_00003728,in_stack_00003720);
          }
          else {
            iVar2 = get_trust(in_stack_ffffffffffffc9b8);
            if (iVar2 < 0x3a) {
              send_to_char((char *)in_stack_ffffffffffffc9d0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
              return;
            }
            local_18 = char_list;
            while (local_18 != (CHAR_DATA *)0x0) {
              local_20 = local_18->next;
              bVar1 = is_npc(in_stack_ffffffffffffc9b8);
              if (!bVar1) {
                iVar2 = get_trust(in_stack_ffffffffffffc9b8);
                iVar3 = get_trust(in_stack_ffffffffffffc9b8);
                if ((iVar2 < iVar3) && (0x32 < local_18->level)) {
                  act((char *)in_stack_ffffffffffffc9d0,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8),
                      (void *)CONCAT44(iVar2,in_stack_ffffffffffffc9c0),in_stack_ffffffffffffc9b8,0)
                  ;
                  interpret(in_stack_00003728,in_stack_00003720);
                }
              }
              local_18 = local_20;
            }
          }
        }
        else {
          iVar2 = get_trust(in_stack_ffffffffffffc9b8);
          if (iVar2 < 0x3a) {
            send_to_char((char *)in_stack_ffffffffffffc9d0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8))
            ;
            return;
          }
          local_18 = char_list;
          while (local_18 != (CHAR_DATA *)0x0) {
            local_20 = local_18->next;
            bVar1 = is_npc(in_stack_ffffffffffffc9b8);
            if (!bVar1) {
              in_stack_ffffffffffffc9c8 = get_trust(in_stack_ffffffffffffc9b8);
              iVar2 = get_trust(in_stack_ffffffffffffc9b8);
              if ((in_stack_ffffffffffffc9c8 < iVar2) && (local_18->level < 0x33)) {
                act((char *)in_stack_ffffffffffffc9d0,
                    (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8),
                    (void *)CONCAT44(in_stack_ffffffffffffc9c4,in_stack_ffffffffffffc9c0),
                    in_stack_ffffffffffffc9b8,0);
                interpret(in_stack_00003728,in_stack_00003720);
              }
            }
            local_18 = local_20;
          }
        }
      }
      else {
        iVar2 = get_trust(in_stack_ffffffffffffc9b8);
        if ((iVar2 < 0x39) && (bVar1 = str_cmp(&stack0xffffffffffffc9d8,"save"), bVar1)) {
          send_to_char((char *)in_stack_ffffffffffffc9d0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
          return;
        }
        local_18 = char_list;
        while (local_18 != (CHAR_DATA *)0x0) {
          local_20 = local_18->next;
          bVar1 = is_npc(in_stack_ffffffffffffc9b8);
          if (!bVar1) {
            in_stack_ffffffffffffc9cc = get_trust(in_stack_ffffffffffffc9b8);
            iVar2 = get_trust(in_stack_ffffffffffffc9b8);
            if (in_stack_ffffffffffffc9cc < iVar2) {
              bVar1 = can_see(in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0);
              if (!bVar1) {
                sprintf(local_1228,"An irresistible urge forces you to \'%s\'.",local_10);
              }
              act((char *)in_stack_ffffffffffffc9d0,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8),
                  (void *)CONCAT44(in_stack_ffffffffffffc9c4,in_stack_ffffffffffffc9c0),
                  in_stack_ffffffffffffc9b8,0);
              interpret(in_stack_00003728,in_stack_00003720);
            }
          }
          local_18 = local_20;
        }
      }
      send_to_char((char *)in_stack_ffffffffffffc9d0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffc9d0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
    }
  }
  return;
}

Assistant:

void do_force(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch, *vch_next;
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];

	argument = one_argument(argument, arg);

	if (arg[0] == '\0' || argument[0] == '\0')
	{
		send_to_char("Force whom to do what?\n\r", ch);
		return;
	}

	one_argument(argument, arg2);

	if (!str_cmp(arg2, "delete") || !str_prefix(arg2, "mob"))
	{
		send_to_char("That will NOT be done.\n\r", ch);
		return;
	}

	sprintf(buf, "$n forces you to '%s'.", argument);

	if (!str_cmp(arg, "all"))
	{
		if (get_trust(ch) < MAX_LEVEL - 3 && str_cmp(arg2, "save"))
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch))
			{
				if (!can_see(vch, ch))
					sprintf(buf, "An irresistible urge forces you to '%s'.", argument);

				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else if (!str_cmp(arg, "players"))
	{
		if (get_trust(ch) < MAX_LEVEL - 2)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch) && vch->level < LEVEL_HERO)
			{
				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else if (!str_cmp(arg, "gods"))
	{
		if (get_trust(ch) < MAX_LEVEL - 2)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch) && vch->level >= LEVEL_HERO)
			{
				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else
	{
		CHAR_DATA *victim = get_char_world(ch, arg);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}

		if (victim == ch)
		{
			send_to_char("Aye aye, right away!\n\r", ch);
			return;
		}

		/*
		if(victim->desc == nullptr)
		{
			send_to_char("They have no descriptor!\n\r",ch);
			return;
		}
		*/

		if (!is_room_owner(ch, victim->in_room)
			&& ch->in_room != victim->in_room
			&& room_is_private(victim->in_room)
			&& !is_trusted(ch, IMPLEMENTOR))
		{
			send_to_char("That character is in a private room.\n\r", ch);
			return;
		}

		if (get_trust(victim) >= get_trust(ch))
		{
			send_to_char("Do it yourself!\n\r", ch);
			return;
		}

		if (!is_npc(victim) && get_trust(ch) < MAX_LEVEL - 3)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		act(buf, ch, nullptr, victim, TO_VICT);
		interpret(victim, argument);
	}

	send_to_char("Ok.\n\r", ch);
}